

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue::~IfcPropertyReferenceValue
          (IfcPropertyReferenceValue *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 *puVar1;
  
  *(undefined8 *)this = 0x8466a8;
  *(undefined8 *)&this->field_0xb0 = 0x846720;
  *(undefined8 *)&this->field_0x58 = 0x8466d0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue,_2UL>).
  _vptr_ObjectHelper = (_func_int **)0x8466f8;
  this_00 = (this->PropertyReference).
            super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  puVar1 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue,_2UL>).
             field_0x10;
  if (puVar1 != &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue,_2UL>)
                 .field_0x20) {
    operator_delete(puVar1);
  }
  *(undefined8 *)this = 0x846838;
  *(undefined8 *)&this->field_0xb0 = 0x846860;
  if (*(undefined1 **)&this->field_0x30 != &this->field_0x40) {
    operator_delete(*(undefined1 **)&this->field_0x30);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
    return;
  }
  return;
}

Assistant:

IfcPropertyReferenceValue() : Object("IfcPropertyReferenceValue") {}